

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *this)

{
  bool bVar1;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  size_t hashval_00;
  size_t sVar2;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_RDI;
  FindInfo FVar3;
  anon_class_16_2_f7bee600 probe_index;
  size_t new_i;
  FindInfo target;
  size_t hashval;
  size_t i;
  slot_type *slot;
  type raw;
  slot_type *in_stack_ffffffffffffff58;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  *in_stack_ffffffffffffff60;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  *in_stack_ffffffffffffff68;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
  *local_60;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *local_40;
  
  bVar1 = IsValidCapacity(in_RDI->capacity_);
  if (!bVar1) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x8f8,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, unsigned long>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, unsigned long>>]"
                 );
  }
  bVar1 = is_small(in_RDI);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    ConvertDeletedToEmptyAndFullToDeleted
              ((ctrl_t *)in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
    local_40 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                *)0x0;
    do {
      if (local_40 ==
          (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
           *)in_RDI->capacity_) {
        reset_growth_left(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68);
        return;
      }
      bVar1 = IsDeleted(*(ctrl_t *)((long)&local_40->ctrl_ + (long)in_RDI->ctrl_));
      if (bVar1) {
        this_00 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   *)hash_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                               *)0x1bab90);
        hash_policy_traits<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,void>
        ::element<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                  ((slot_type *)0x1babaf);
        hashval_00 = hash_policy_traits<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,void>
                     ::
                     apply<phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,phmap::Hash<std::__cxx11::string>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>::HashElement,std::pair<std::__cxx11::string_const,unsigned_long>&,phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>>
                               ((HashElement *)in_stack_ffffffffffffff60,
                                &in_stack_ffffffffffffff58->value);
        FVar3 = find_first_non_full(this_00,local_60._8_8_);
        local_60 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>
                    *)FVar3.offset;
        in_stack_ffffffffffffff78 =
             drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                       ((anon_class_16_2_f7bee600 *)in_RDI,in_stack_ffffffffffffff78);
        sVar2 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                          ((anon_class_16_2_f7bee600 *)in_RDI,in_stack_ffffffffffffff78);
        _local_60 = FVar3;
        if (in_stack_ffffffffffffff78 == sVar2) {
          in_stack_ffffffffffffff70 = local_40;
          H2(hashval_00);
          set_ctrl(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                   (ctrl_t)((ulong)in_stack_ffffffffffffff60 >> 0x38));
        }
        else {
          bVar1 = IsEmpty((ctrl_t)local_60[(long)in_RDI->ctrl_]);
          if (bVar1) {
            H2(hashval_00);
            set_ctrl(in_stack_ffffffffffffff70,(size_t)local_60,
                     (ctrl_t)((ulong)in_stack_ffffffffffffff60 >> 0x38));
            alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)0x1bacad);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,void>
            ::transfer<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,(slot_type *)0x1bacd4);
            set_ctrl(in_stack_ffffffffffffff70,(size_t)local_60,
                     (ctrl_t)((ulong)in_stack_ffffffffffffff60 >> 0x38));
            in_stack_ffffffffffffff68 = local_60;
          }
          else {
            bVar1 = IsDeleted((ctrl_t)local_60[(long)in_RDI->ctrl_]);
            if (!bVar1) {
              __assert_fail("IsDeleted(ctrl_[new_i])",
                            "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                            ,0x92b,
                            "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, unsigned long>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, unsigned long>>]"
                           );
            }
            H2(hashval_00);
            set_ctrl(in_stack_ffffffffffffff70,(size_t)in_stack_ffffffffffffff68,
                     (ctrl_t)((ulong)local_60 >> 0x38));
            alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)0x1bad5a);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,void>
            ::transfer<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      (local_60,in_stack_ffffffffffffff58,(slot_type *)0x1bad79);
            alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)0x1bad83);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,void>
            ::transfer<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      (local_60,in_stack_ffffffffffffff58,(slot_type *)0x1badaa);
            alloc_ref((raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                       *)0x1badb4);
            hash_policy_traits<phmap::priv::FlatHashMapPolicy<std::__cxx11::string,unsigned_long>,void>
            ::transfer<std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>>
                      (local_60,in_stack_ffffffffffffff58,(slot_type *)0x1badd3);
            local_40 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                        *)((long)&local_40[-1].settings_.
                                  super_CompressedTupleImpl<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>_>
                                  .
                                  super_Storage<phmap::priv::CompressedTuple<unsigned_long,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>,_0UL,_false>
                                  .value + 7);
            in_stack_ffffffffffffff60 = local_60;
          }
        }
      }
      local_40 = (raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_phmap::Hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_phmap::EqualTo<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                  *)((long)&local_40->ctrl_ + 1);
    } while( true );
  }
  __assert_fail("!is_small()",
                "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                ,0x8f9,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, phmap::Hash<std::basic_string<char>>, phmap::EqualTo<std::basic_string<char>>, std::allocator<std::pair<const std::basic_string<char>, unsigned long>>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, unsigned long>, Hash = phmap::Hash<std::basic_string<char>>, Eq = phmap::EqualTo<std::basic_string<char>>, Alloc = std::allocator<std::pair<const std::basic_string<char>, unsigned long>>]"
               );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
				assert(IsValidCapacity(capacity_));
				assert(!is_small());
				// Algorithm:
				// - mark all DELETED slots as EMPTY
				// - mark all FULL slots as DELETED
				// - for each slot marked as DELETED
				//     hash = Hash(element)
				//     target = find_first_non_full(hash)
				//     if target is in the same group
				//       mark slot as FULL
				//     else if target is EMPTY
				//       transfer element to target
				//       mark slot as EMPTY
				//       mark target as FULL
				//     else if target is DELETED
				//       swap current element with target element
				//       mark target as FULL
				//       repeat procedure for current slot with moved from element (target)
				ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
				typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
				raw;
				slot_type* slot = reinterpret_cast<slot_type*>(&raw);
				for (size_t i = 0; i != capacity_; ++i)
				{
					if (!IsDeleted(ctrl_[i])) continue;
					size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
					PolicyTraits::element(slots_ + i));
					auto target = find_first_non_full(hashval);
					size_t new_i = target.offset;

					// Verify if the old and new i fall within the same group wrt the hashval.
					// If they do, we don't need to move the object as it falls already in the
					// best probe we can.
					const auto probe_index = [&](size_t pos) {
						return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
					};

					// Element doesn't move.
					if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
						set_ctrl(i, H2(hashval));
						continue;
					}
					if (IsEmpty(ctrl_[new_i])) {
						// Transfer element to the empty spot.
						// set_ctrl poisons/unpoisons the slots so we have to call it at the
						// right time.
						set_ctrl(new_i, H2(hashval));
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
						set_ctrl(i, kEmpty);
					}
					else {
						assert(IsDeleted(ctrl_[new_i]));
						set_ctrl(new_i, H2(hashval));
						// Until we are done rehashing, DELETED marks previously FULL slots.
						// Swap i and new_i elements.
						PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
						PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
						--i;  // repeat
					}
				}
				reset_growth_left(capacity_);
			}